

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFO.cpp
# Opt level: O1

bool __thiscall UFO::logic(UFO *this,int step)

{
  int *piVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  Player *this_00;
  ResourceManager *this_01;
  Entity *this_02;
  _List_node_base *this_03;
  _List_node_base *p_Var6;
  float fVar7;
  float fVar8;
  double dVar9;
  
  this_00 = (Player *)Entity::getPlayerCollision(&this->super_Entity);
  if (this_00 != (Player *)0x0) {
    Entity::explode(&this->super_Entity);
    (*(this_00->super_Entity)._vptr_Entity[4])(this_00,1);
    Player::die(this_00);
    my_play_sample(0x1c);
    return false;
  }
  dVar9 = (double)al_get_time();
  if (this->nextShot < (int)(dVar9 * 1000.0)) {
    this->nextShot = (int)(dVar9 * 1000.0) + *(int *)&(this->super_Entity).field_0x34;
    this_01 = ResourceManager::getInstance();
    this_02 = (Entity *)ResourceManager::getData(this_01,1);
    fVar7 = Entity::getX(this_02);
    fVar8 = Entity::getY(this_02);
    fVar7 = atan2f(fVar8 - (this->super_Entity).y,fVar7 - (this->super_Entity).x);
    this_03 = (_List_node_base *)operator_new(0x68);
    LargeSlowBullet::LargeSlowBullet
              ((LargeSlowBullet *)this_03,(this->super_Entity).x,(this->super_Entity).y,fVar7,
               &this->super_Entity);
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = this_03;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    new_entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl._M_node.
    _M_size = new_entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
              _M_node._M_size + 1;
    my_play_sample(0x1d);
  }
  piVar1 = &this->bitmapFrameCount;
  iVar2 = *piVar1;
  *piVar1 = *piVar1 - step;
  if (*piVar1 == 0 || SBORROW4(iVar2,step) != *piVar1 < 0) {
    this->bitmapFrameCount = this->ANIMATION_SPEED;
    this->bitmapFrame = ((this->bitmapFrame + 1) / 3) * -3 + this->bitmapFrame + 1;
  }
  uVar3 = this->speed_x;
  uVar4 = this->speed_y;
  (this->super_Entity).dx = (float)step * (float)uVar3;
  (this->super_Entity).dy = (float)step * (float)uVar4;
  Entity::wrap(&this->super_Entity);
  bVar5 = Entity::logic(&this->super_Entity,step);
  return bVar5;
}

Assistant:

bool UFO::logic(int step)
{
   Player *p = (Player *)getPlayerCollision();
   if (p) {
      explode();
      p->hit(1);
      p->die();
      my_play_sample(RES_COLLISION);
      return false;
   }

   int now = (int) (al_get_time() * 1000.0);
   if (now > nextShot) {
      nextShot = now + SHOT_SPEED;
      ResourceManager& rm = ResourceManager::getInstance();
      Player *p = (Player *)rm.getData(RES_PLAYER);
      float px = p->getX();
      float py = p->getY();
      float shot_angle = atan2(py-y, px-x);
      LargeSlowBullet *b = new LargeSlowBullet(x, y, shot_angle, this);
      new_entities.push_back(b);
      my_play_sample(RES_FIRELARGE);
   }

   bitmapFrameCount -= step;
   if (bitmapFrameCount <= 0) {
      bitmapFrameCount = ANIMATION_SPEED;
      bitmapFrame++;
      bitmapFrame %= 3; // loop
   }
   
   dx = speed_x * step;
   dy = speed_y * step;

   Entity::wrap();

   if (!Entity::logic(step))
      return false;

   return true;
}